

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

RecyclableObject * __thiscall
Js::RecyclableObject::CloneToScriptContext(RecyclableObject *this,ScriptContext *requestContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var aValue;
  RecyclableObject *pRVar6;
  
  TVar1 = ((this->type).ptr)->typeId;
  if (0x57 < (int)TVar1) {
    BVar4 = IsExternal(this);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00c57858;
      *puVar5 = 0;
    }
  }
  if (TVar1 == TypeIds_Number) {
    aValue = JavascriptNumber::CloneToScriptContext(this,requestContext);
    pRVar6 = VarTo<Js::RecyclableObject>(aValue);
    return pRVar6;
  }
  if (TVar1 == TypeIds_Null) {
    pRVar6 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  }
  else {
    if (TVar1 != TypeIds_Undefined) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x110,"(0)","shouldn\'t clone for other types");
      if (bVar3) {
        *puVar5 = 0;
        JavascriptError::ThrowError(requestContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
LAB_00c57858:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pRVar6 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  return pRVar6;
}

Assistant:

RecyclableObject * RecyclableObject::CloneToScriptContext(ScriptContext* requestContext)
    {
        switch (JavascriptOperators::GetTypeId(this))
        {
        case TypeIds_Undefined:
            return requestContext->GetLibrary()->GetUndefined();
        case TypeIds_Null:
            return requestContext->GetLibrary()->GetNull();
        case TypeIds_Number:
            return VarTo<RecyclableObject>(JavascriptNumber::CloneToScriptContext(this, requestContext));
        default:
            AssertMsg(FALSE, "shouldn't clone for other types");
            Js::JavascriptError::ThrowError(requestContext, VBSERR_InternalError);
        }
    }